

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iSWAP.cpp
# Opt level: O3

void test_qclab_qgates_iSWAP<std::complex<double>>(void)

{
  bool bVar1;
  bool bVar2;
  allocator_type aVar3;
  int iVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  _Type aiVar7;
  long lVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  pointer *__ptr;
  iterator pcVar11;
  long lVar12;
  char *pcVar13;
  char *in_R9;
  pointer *__ptr_5;
  byte bVar14;
  initializer_list<std::complex<double>_> __l;
  initializer_list<std::complex<double>_> __l_00;
  initializer_list<std::complex<double>_> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<int> __l_06;
  initializer_list<int> __l_07;
  initializer_list<int> __l_08;
  initializer_list<std::complex<double>_> __l_09;
  initializer_list<std::complex<double>_> __l_10;
  initializer_list<std::complex<double>_> __l_11;
  initializer_list<std::complex<double>_> __l_12;
  iSWAP<std::complex<double>_> iswap_1;
  int qubits_1 [2];
  vector<int,_std::allocator<int>_> qubits;
  V vec4;
  iSWAP<std::complex<double>_> iswap;
  V check4;
  V v4;
  V v3;
  stringstream qasm;
  V v2;
  undefined1 local_4f8 [8];
  array<int,_2UL> local_4f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e8;
  undefined1 local_4d8 [8];
  _Head_base<0UL,_std::complex<double>_*,_false> local_4d0;
  pointer local_4c8;
  undefined1 local_4c0 [8];
  _Head_base<0UL,_std::complex<double>_*,_false> local_4b8;
  pointer local_4b0;
  undefined1 local_4a8 [8];
  _Head_base<0UL,_std::complex<double>_*,_false> local_4a0;
  pointer local_498;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_490;
  iSWAP<std::complex<double>_> local_478;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_468;
  allocator_type local_449;
  SquareMatrix<std::complex<double>_> local_448;
  SquareMatrix<std::complex<double>_> local_438;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_428;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_410;
  SquareMatrix<std::complex<double>_> local_3f8;
  SquareMatrix<std::complex<double>_> local_3e8;
  SquareMatrix<std::complex<double>_> local_3d8;
  SquareMatrix<std::complex<double>_> local_3c8;
  undefined1 local_3b8 [8];
  array<int,_2UL> aStack_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  undefined8 local_398;
  undefined1 *puStack_390;
  undefined1 *local_388;
  undefined8 uStack_380;
  ios_base local_338 [128];
  undefined1 local_2b8 [144];
  SquareMatrix<std::complex<double>_> local_228;
  SquareMatrix<std::complex<double>_> local_218;
  SquareMatrix<std::complex<double>_> local_208;
  SquareMatrix<std::complex<double>_> local_1f8;
  SquareMatrix<std::complex<double>_> local_1e8;
  SquareMatrix<std::complex<double>_> local_1d8;
  SquareMatrix<std::complex<double>_> local_1c8;
  SquareMatrix<std::complex<double>_> local_1b8;
  SquareMatrix<std::complex<double>_> local_1a8;
  SquareMatrix<std::complex<double>_> local_198;
  SquareMatrix<std::complex<double>_> local_188;
  SquareMatrix<std::complex<double>_> local_178;
  SquareMatrix<std::complex<double>_> local_168;
  SquareMatrix<std::complex<double>_> local_158;
  SquareMatrix<std::complex<double>_> local_148;
  SquareMatrix<std::complex<double>_> local_138;
  SquareMatrix<std::complex<double>_> local_128;
  SquareMatrix<std::complex<double>_> local_118;
  SquareMatrix<std::complex<double>_> local_108;
  SquareMatrix<std::complex<double>_> local_f8;
  SquareMatrix<std::complex<double>_> local_e8;
  SquareMatrix<std::complex<double>_> local_d8;
  SquareMatrix<std::complex<double>_> local_c8;
  SquareMatrix<std::complex<double>_> local_b8;
  SquareMatrix<std::complex<double>_> local_a8;
  SquareMatrix<std::complex<double>_> local_98;
  SquareMatrix<std::complex<double>_> local_88;
  SquareMatrix<std::complex<double>_> local_78;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_68;
  SquareMatrix<std::complex<double>_> local_50;
  undefined1 local_40 [8];
  void *local_38;
  
  bVar14 = 0;
  qclab::dense::eye<std::complex<double>>((int64_t)&local_438);
  qclab::dense::eye<std::complex<double>>((int64_t)&local_50);
  qclab::dense::eye<std::complex<double>>((int64_t)&local_448);
  qclab::dense::eye<std::complex<double>>((int64_t)local_40);
  local_388 = &DAT_401c000000000000;
  uStack_380 = 0;
  local_398 = 0x4000000000000000;
  puStack_390 = (undefined1 *)0x0;
  local_3a8._M_allocated_capacity = (size_type)&DAT_4014000000000000;
  local_3a8._8_8_ = 0;
  local_3b8 = (undefined1  [8])&DAT_4008000000000000;
  aStack_3b0._M_elems[0] = 0;
  aStack_3b0._M_elems[1] = 0;
  __l._M_len = 4;
  __l._M_array = (iterator)local_3b8;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&local_68,__l,(allocator_type *)local_4f8);
  puVar5 = &DAT_0045ffd0;
  pcVar11 = (iterator)local_3b8;
  for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
    *(undefined8 *)pcVar11->_M_value = *puVar5;
    puVar5 = puVar5 + (ulong)bVar14 * -2 + 1;
    pcVar11 = (iterator)(pcVar11[-(ulong)bVar14]._M_value + 8);
  }
  __l_00._M_len = 8;
  __l_00._M_array = (iterator)local_3b8;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&local_410,__l_00,(allocator_type *)local_4f8);
  memcpy((iterator)local_3b8,&DAT_00460050,0x100);
  __l_01._M_len = 0x10;
  __l_01._M_array = (iterator)local_3b8;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&local_428,__l_01,(allocator_type *)local_4f8);
  local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)&PTR_nbQubits_004ee7a0;
  local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x100000000;
  local_4f8._0_4_ = 2;
  local_4c0._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_3b8,"iswap.nbQubits()","2",(int *)local_4f8,(int *)local_4c0);
  if (local_3b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_4f8);
    if (aStack_3b0._M_elems == (_Type)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)aStack_3b0._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_4c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x3b,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_4c0,(Message *)local_4f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4c0);
    if (local_4f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_4f8 + 8))();
    }
  }
  if (aStack_3b0._M_elems != (_Type)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&aStack_3b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 aStack_3b0._M_elems);
  }
  local_4f8._0_4_ =
       (int)local_490.
            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
            .super__Vector_impl_data._M_finish;
  local_4c0 = (undefined1  [8])((ulong)local_4c0 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_3b8,"iswap.qubit()","0",(int *)local_4f8,(int *)local_4c0);
  if (local_3b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_4f8);
    if (aStack_3b0._M_elems == (_Type)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)aStack_3b0._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_4c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x40,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_4c0,(Message *)local_4f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4c0);
    if (local_4f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_4f8 + 8))();
    }
  }
  if (aStack_3b0._M_elems != (_Type)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&aStack_3b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 aStack_3b0._M_elems);
  }
  local_3b8 = (undefined1  [8])
              local_490.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_3b8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_4c0,__l_02,(allocator_type *)local_4f8);
  local_4f8 = (undefined1  [8])((long)local_4b8._M_head_impl - (long)local_4c0 >> 2);
  local_4d8._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_3b8,"qubits.size()","2",(unsigned_long *)local_4f8,(int *)local_4d8);
  if (local_3b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_4f8);
    if (aStack_3b0._M_elems == (_Type)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)aStack_3b0._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_4d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x44,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_4d8,(Message *)local_4f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4d8);
    if (local_4f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_4f8 + 8))();
    }
  }
  if (aStack_3b0._M_elems != (_Type)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&aStack_3b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 aStack_3b0._M_elems);
  }
  local_4f8 = (undefined1  [8])((ulong)local_4f8 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_3b8,"qubits[0]","0",(int *)local_4c0,(int *)local_4f8);
  if (local_3b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_4f8);
    if (aStack_3b0._M_elems == (_Type)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)aStack_3b0._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_4d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x45,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_4d8,(Message *)local_4f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4d8);
    if (local_4f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_4f8 + 8))();
    }
  }
  if (aStack_3b0._M_elems != (_Type)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&aStack_3b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 aStack_3b0._M_elems);
  }
  local_4f8._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_3b8,"qubits[1]","1",(int *)((long)local_4c0 + 4),(int *)local_4f8);
  if (local_3b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_4f8);
    if (aStack_3b0._M_elems == (_Type)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)aStack_3b0._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_4d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x46,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_4d8,(Message *)local_4f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4d8);
    if (local_4f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_4f8 + 8))();
    }
  }
  if (aStack_3b0._M_elems != (_Type)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&aStack_3b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 aStack_3b0._M_elems);
  }
  local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)&DAT_500000003;
  local_4d8 = (undefined1  [8])&DAT_500000003;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)local_4d8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_3b8,__l_03,(allocator_type *)local_4a8);
  local_4d8._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_4f8,"iswap.qubits()[0]","3",(int *)local_3b8,(int *)local_4d8);
  if (local_3b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_3b8,local_3a8._M_allocated_capacity - (long)local_3b8);
  }
  if (local_4f8[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_3b8);
    if (local_4f0._M_elems == (_Type)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)local_4f0._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_4d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x49,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_4d8,(Message *)local_3b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4d8);
    if (local_3b8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_3b8 + 8))();
    }
  }
  if (local_4f0._M_elems != (_Type)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_4f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_4f0._M_elems);
  }
  local_4d8 = (undefined1  [8])
              local_490.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)local_4d8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_3b8,__l_04,(allocator_type *)local_4a8);
  local_4d8._0_4_ = 5;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_4f8,"iswap.qubits()[1]","5",(int *)((long)local_3b8 + 4),
             (int *)local_4d8);
  if (local_3b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_3b8,local_3a8._M_allocated_capacity - (long)local_3b8);
  }
  if (local_4f8[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_3b8);
    if (local_4f0._M_elems == (_Type)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)local_4f0._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_4d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x4a,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_4d8,(Message *)local_3b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4d8);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_3b8 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(size_type *)local_3b8 + 8))();
    }
  }
  if (local_4f0._M_elems != (_Type)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_4f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_4f0._M_elems);
  }
  local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x100000000;
  puVar5 = (undefined8 *)operator_new__(0x100);
  *puVar5 = 0x3ff0000000000000;
  puVar5[1] = 0;
  puVar5[2] = 0;
  puVar5[3] = 0;
  puVar5[4] = 0;
  puVar5[5] = 0;
  puVar5[6] = 0;
  puVar5[7] = 0;
  puVar5[8] = 0;
  puVar5[9] = 0;
  puVar5[10] = 0;
  puVar5[0xb] = 0;
  puVar5[0xc] = 0;
  puVar5[0xd] = 0x3ff0000000000000;
  puVar5[0xe] = 0;
  puVar5[0xf] = 0;
  puVar5[0x10] = 0;
  puVar5[0x11] = 0;
  puVar5[0x12] = 0;
  puVar5[0x13] = 0x3ff0000000000000;
  puVar5[0x14] = 0;
  puVar5[0x15] = 0;
  puVar5[0x16] = 0;
  puVar5[0x17] = 0;
  puVar5[0x18] = 0;
  puVar5[0x19] = 0;
  puVar5[0x1a] = 0;
  puVar5[0x1b] = 0;
  puVar5[0x1c] = 0;
  puVar5[0x1d] = 0;
  puVar5[0x1e] = 0x3ff0000000000000;
  puVar5[0x1f] = 0;
  puVar6 = (undefined8 *)operator_new__(0x100);
  *puVar6 = 0x3ff0000000000000;
  puVar9 = puVar6 + 1;
  puVar6[1] = 0;
  puVar6[2] = 0;
  puVar6[3] = 0;
  puVar6[4] = 0;
  puVar6[5] = 0;
  puVar6[6] = 0;
  puVar6[7] = 0;
  puVar6[8] = 0;
  puVar6[9] = 0;
  puVar6[10] = 0;
  puVar6[0xb] = 0;
  puVar6[0xc] = 0;
  puVar6[0xd] = 0x3ff0000000000000;
  puVar6[0xe] = 0;
  puVar6[0xf] = 0;
  puVar6[0x10] = 0;
  puVar6[0x11] = 0;
  puVar6[0x12] = 0;
  puVar6[0x13] = 0x3ff0000000000000;
  puVar6[0x14] = 0;
  puVar6[0x15] = 0;
  puVar6[0x16] = 0;
  puVar6[0x17] = 0;
  puVar6[0x18] = 0;
  puVar6[0x19] = 0;
  puVar6[0x1a] = 0;
  puVar6[0x1b] = 0;
  puVar6[0x1c] = 0;
  puVar6[0x1d] = 0;
  puVar6[0x1e] = 0x3ff0000000000000;
  puVar6[0x1f] = 0;
  puVar10 = puVar5 + 1;
  lVar8 = 0;
  do {
    lVar12 = 0;
    do {
      bVar1 = *(double *)((long)puVar10 + lVar12 + -8) == *(double *)((long)puVar9 + lVar12 + -8);
      bVar2 = *(double *)((long)puVar9 + lVar12) == *(double *)((long)puVar10 + lVar12);
      if (!bVar2 || !bVar1) goto LAB_0034de9f;
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x40);
    lVar8 = lVar8 + 1;
    puVar9 = puVar9 + 8;
    puVar10 = puVar10 + 8;
  } while (lVar8 != 4);
LAB_0034de9f:
  local_4f8[0] = (allocator_type)(bVar2 && bVar1);
  local_4f0._M_elems[0] = 0;
  local_4f0._M_elems[1] = 0;
  operator_delete__(puVar6);
  if (local_4f8[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_4d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_3b8,(internal *)local_4f8,
               (AssertionResult *)"iswap.matrix() == iSWAP_check","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_4a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x55,(char *)local_3b8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_4a8,(Message *)local_4d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4a8);
    if (local_3b8 != (undefined1  [8])&local_3a8) {
      operator_delete((void *)local_3b8,(ulong)(local_3a8._M_allocated_capacity + 1));
    }
    if (local_4d8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_4d8 + 8))();
    }
  }
  if (local_4f0._M_elems != (_Type)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_4f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_4f0._M_elems);
  }
  qclab::qgates::QGate2<std::complex<double>_>::print((QGate2<std::complex<double>_> *)&local_490);
  std::__cxx11::stringstream::stringstream((stringstream *)local_3b8);
  iVar4 = qclab::qgates::iSWAP<std::complex<double>_>::toQASM
                    ((iSWAP<std::complex<double>_> *)&local_490,(ostream *)local_3a8._M_local_buf,0)
  ;
  local_4d8._0_4_ = iVar4;
  local_4a8 = (undefined1  [8])((ulong)(uint)local_4a8._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_4f8,"iswap.toQASM( qasm )","0",(int *)local_4d8,(int *)local_4a8);
  if (local_4f8[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_4d8);
    if (local_4f0._M_elems == (_Type)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)local_4f0._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_4a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x5c,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_4a8,(Message *)local_4d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4a8);
    if (local_4d8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_4d8 + 8))();
    }
  }
  if (local_4f0._M_elems != (_Type)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_4f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_4f0._M_elems);
  }
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[19]>
            ((internal *)local_4d8,"qasm.str()","\"iswap q[0], q[1];\\n\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f8,
             (char (*) [19])"iswap q[0], q[1];\n");
  if (local_4f8 != (undefined1  [8])&local_4e8) {
    operator_delete((void *)local_4f8,local_4e8._M_allocated_capacity + 1);
  }
  if (local_4d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_4f8);
    if ((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)
        local_4d0._M_head_impl ==
        (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)local_4d0._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_4a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x5d,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_4a8,(Message *)local_4f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4a8);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_4f8 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_4f8 + 8))();
    }
  }
  if (local_4d0._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_4d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_4d0._M_head_impl);
  }
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)local_4f8,(long)local_4f0._M_elems);
  if (local_4f8 != (undefined1  [8])&local_4e8) {
    operator_delete((void *)local_4f8,local_4e8._M_allocated_capacity + 1);
  }
  local_4d8 = (undefined1  [8])&PTR_nbQubits_004ee7a0;
  local_4d0._M_head_impl = (complex<double> *)0x400000002;
  iVar4 = (**(code **)((pointer)
                      ((long)local_490.
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 0x70))->_M_value)();
  aVar3 = SUB41(iVar4,0);
  local_4a0._M_head_impl = (complex<double> *)0x0;
  local_4a8[0] = aVar3;
  if (aVar3 == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_468);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_4f8,(internal *)local_4a8,(AssertionResult *)"iswap == iswap2",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_478,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x62,(char *)local_4f8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_478,(Message *)&local_468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_478);
    if (local_4f8 != (undefined1  [8])&local_4e8) {
      operator_delete((void *)local_4f8,local_4e8._M_allocated_capacity + 1);
    }
    if (local_468.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)(local_468.
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8))();
    }
    if (local_4a0._M_head_impl != (complex<double> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_4a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4a0._M_head_impl);
    }
  }
  iVar4 = (**(code **)((pointer)
                      ((long)local_490.
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + 0x70))->_M_value)
                    (&local_490,local_4d8);
  local_4a8[0] = (allocator_type)(char)iVar4;
  local_4a0._M_head_impl = (complex<double> *)0x0;
  if ((char)iVar4 == '\0') {
    testing::Message::Message((Message *)&local_468);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_4f8,(internal *)local_4a8,(AssertionResult *)"iswap != iswap2","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_478,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,99,(char *)local_4f8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_478,(Message *)&local_468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_478);
    if (local_4f8 != (undefined1  [8])&local_4e8) {
      operator_delete((void *)local_4f8,local_4e8._M_allocated_capacity + 1);
    }
    if (local_468.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*(long *)(local_468.
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_value + 8))();
    }
    if (local_4a0._M_head_impl != (complex<double> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_4a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_4a0._M_head_impl);
    }
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_3b8);
  std::ios_base::~ios_base(local_338);
  operator_delete__(puVar5);
  if (local_4c0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_4c0,(long)local_4b0 - (long)local_4c0);
  }
  local_4f8._0_4_ = 2;
  local_4c0._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_3b8,"iswap.nbQubits()","2",(int *)local_4f8,(int *)local_4c0);
  if (local_3b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_4f8);
    if (aStack_3b0._M_elems == (_Type)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)aStack_3b0._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_4c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x69,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_4c0,(Message *)local_4f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4c0);
    if (local_4f8 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_4f8 + 8))();
    }
  }
  if (aStack_3b0._M_elems != (_Type)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&aStack_3b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 aStack_3b0._M_elems);
  }
  local_4c0 = (undefined1  [8])&DAT_500000003;
  __l_05._M_len = 2;
  __l_05._M_array = (iterator)local_4c0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_3b8,__l_05,(allocator_type *)&local_490);
  local_4c0._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_4f8,"iswap.qubits()[0]","3",(int *)local_3b8,(int *)local_4c0);
  if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )local_3b8 !=
      (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    operator_delete((void *)local_3b8,local_3a8._M_allocated_capacity - (long)local_3b8);
  }
  if (local_4f8[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_3b8);
    if (local_4f0._M_elems == (_Type)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)local_4f0._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_4c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x6c,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_4c0,(Message *)local_3b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4c0);
    if (local_3b8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_3b8 + 8))();
    }
  }
  if (local_4f0._M_elems != (_Type)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_4f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_4f0._M_elems);
  }
  local_4c0 = (undefined1  [8])&DAT_500000003;
  __l_06._M_len = 2;
  __l_06._M_array = (iterator)local_4c0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_3b8,__l_06,(allocator_type *)&local_490);
  local_4c0._0_4_ = 5;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_4f8,"iswap.qubits()[1]","5",(int *)((long)local_3b8 + 4),
             (int *)local_4c0);
  if (local_3b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_3b8,local_3a8._M_allocated_capacity - (long)local_3b8);
  }
  if (local_4f8[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)local_3b8);
    if (local_4f0._M_elems == (_Type)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)local_4f0._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_4c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x6d,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_4c0,(Message *)local_3b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_4c0);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_3b8 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(size_type *)local_3b8 + 8))();
    }
  }
  if (local_4f0._M_elems != (_Type)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_4f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_4f0._M_elems);
  }
  local_4d8 = (undefined1  [8])&DAT_500000003;
  qclab::qgates::iSWAP<std::complex<double>_>::iSWAP
            ((iSWAP<std::complex<double>_> *)local_4f8,(int *)local_4d8);
  local_4c0._0_4_ = 2;
  local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_490.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,2);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_3b8,"iswap.nbQubits()","2",(int *)local_4c0,(int *)&local_490);
  if (local_3b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_4c0);
    if (aStack_3b0._M_elems == (_Type)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)aStack_3b0._M_elems;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_490,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x74,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_490,(Message *)local_4c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_490);
    if (local_4c0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_4c0 + 8))();
    }
  }
  if (aStack_3b0._M_elems != (_Type)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&aStack_3b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 aStack_3b0._M_elems);
  }
  local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)local_4f0._M_elems;
  __l_07._M_len = 2;
  __l_07._M_array = (iterator)&local_490;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_3b8,__l_07,(allocator_type *)local_4a8);
  local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_490.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,3);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_4c0,"iswap.qubits()[0]","3",(int *)local_3b8,(int *)&local_490);
  if (local_3b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_3b8,local_3a8._M_allocated_capacity - (long)local_3b8);
  }
  if (local_4c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_3b8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b8._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = ((_Alloc_hider *)(local_4b8._M_head_impl)->_M_value)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_490,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x77,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_490,(Message *)local_3b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_490);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_3b8 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(size_type *)local_3b8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b8._M_head_impl !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_4b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_4b8._M_head_impl);
  }
  local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)local_4f0._M_elems;
  __l_08._M_len = 2;
  __l_08._M_array = (iterator)&local_490;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_3b8,__l_08,(allocator_type *)local_4a8);
  local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_490.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,5);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_4c0,"iswap.qubits()[1]","5",(int *)((long)local_3b8 + 4),
             (int *)&local_490);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_3b8 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete((void *)local_3b8,local_3a8._M_allocated_capacity - (long)local_3b8);
  }
  if (local_4c0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_3b8);
    if (local_4b8._M_head_impl == (complex<double> *)0x0) {
      pcVar13 = "";
    }
    else {
      pcVar13 = *(char **)local_4b8._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_490,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/iSWAP.cpp"
               ,0x78,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_490,(Message *)local_3b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_490);
    if (local_3b8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_3b8 + 8))();
    }
  }
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_4b8._M_head_impl != (complex<double> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_4b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_4b8._M_head_impl);
  }
  local_478.super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject =
       (QObject<std::complex<double>_>)&PTR_nbQubits_004ee7a0;
  local_478.qubits_._M_elems[0] = 0;
  local_478.qubits_._M_elems[1] = 1;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4f8,
             &local_68);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            (&local_478,NoTrans,2,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4f8,0);
  local_388 = &DAT_401c000000000000;
  uStack_380 = 0;
  local_398 = 0;
  puStack_390 = &DAT_4014000000000000;
  local_3a8._M_allocated_capacity = 0;
  local_3a8._8_8_ = 0x4000000000000000;
  local_3b8 = (undefined1  [8])&DAT_4008000000000000;
  aStack_3b0._M_elems[0] = 0;
  aStack_3b0._M_elems[1] = 0;
  __l_09._M_len = 4;
  __l_09._M_array = (iterator)local_3b8;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4c0,
             __l_09,(allocator_type *)&local_490);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4f8,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4c0);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4f8,
             &local_68);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            (&local_478,ConjTrans,2,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4f8,0);
  local_388 = &DAT_401c000000000000;
  uStack_380 = 0;
  local_398 = 0;
  puStack_390 = (undefined1 *)0xc014000000000000;
  local_3a8._M_allocated_capacity = 0;
  local_3a8._8_8_ = 0xc000000000000000;
  local_3b8 = (undefined1  [8])&DAT_4008000000000000;
  aStack_3b0._M_elems[0] = 0;
  aStack_3b0._M_elems[1] = 0;
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)local_4c0,
             local_3b8);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4f8,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4c0);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&local_490,&local_410);
  qclab::qgates::iSWAP<std::complex<double>_>::apply(&local_478,NoTrans,3,&local_490,0);
  puVar5 = &DAT_004601d0;
  pcVar11 = (iterator)local_3b8;
  for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
    *(undefined8 *)pcVar11->_M_value = *puVar5;
    puVar5 = puVar5 + (ulong)bVar14 * -2 + 1;
    pcVar11 = (iterator)(pcVar11[-(ulong)bVar14]._M_value + 8);
  }
  __l_10._M_len = 8;
  __l_10._M_array = (iterator)local_3b8;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4d8,
             __l_10,(allocator_type *)local_4a8);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            (&local_490,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4d8);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            (&local_490,&local_410);
  qclab::qgates::iSWAP<std::complex<double>_>::apply(&local_478,ConjTrans,3,&local_490,0);
  puVar5 = &DAT_00460250;
  puVar6 = (undefined8 *)local_3b8;
  for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar6 = *puVar5;
    puVar5 = puVar5 + (ulong)bVar14 * -2 + 1;
    puVar6 = puVar6 + (ulong)bVar14 * -2 + 1;
  }
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)local_4d8,
             local_3b8,local_338);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            (&local_490,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4d8);
  local_478.qubits_._M_elems[0] = 1;
  local_478.qubits_._M_elems[1] = 2;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            (&local_490,&local_410);
  qclab::qgates::iSWAP<std::complex<double>_>::apply(&local_478,NoTrans,3,&local_490,0);
  puVar5 = &DAT_004602d0;
  puVar6 = (undefined8 *)local_3b8;
  for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar6 = *puVar5;
    puVar5 = puVar5 + (ulong)bVar14 * -2 + 1;
    puVar6 = puVar6 + (ulong)bVar14 * -2 + 1;
  }
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)local_4d8,
             local_3b8,local_338);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            (&local_490,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4d8);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            (&local_490,&local_410);
  qclab::qgates::iSWAP<std::complex<double>_>::apply(&local_478,ConjTrans,3,&local_490,0);
  puVar5 = &DAT_00460350;
  puVar6 = (undefined8 *)local_3b8;
  for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar6 = *puVar5;
    puVar5 = puVar5 + (ulong)bVar14 * -2 + 1;
    puVar6 = puVar6 + (ulong)bVar14 * -2 + 1;
  }
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)local_4d8,
             local_3b8,local_338);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            (&local_490,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4d8);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4a8,
             &local_428);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            (&local_478,NoTrans,4,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4a8,0);
  memcpy((iterator)local_3b8,&DAT_004603d0,0x100);
  __l_11._M_len = 0x10;
  __l_11._M_array = (iterator)local_3b8;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&local_468,__l_11,&local_449);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4a8,
             &local_468);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4a8,
             &local_428);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            (&local_478,ConjTrans,4,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4a8,0);
  memcpy(local_3b8,&DAT_004604d0,0x100);
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&local_468,
             local_3b8,local_2b8);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4a8,
             &local_468);
  local_478.qubits_._M_elems[0] = 0;
  local_478.qubits_._M_elems[1] = 1;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4a8,
             &local_428);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            (&local_478,NoTrans,4,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4a8,0);
  memcpy(local_3b8,&DAT_004605d0,0x100);
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&local_468,
             local_3b8,local_2b8);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4a8,
             &local_468);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4a8,
             &local_428);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            (&local_478,ConjTrans,4,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4a8,0);
  memcpy(local_3b8,&DAT_004606d0,0x100);
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&local_468,
             local_3b8,local_2b8);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4a8,
             &local_468);
  local_478.qubits_._M_elems = (_Type)&DAT_300000002;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4a8,
             &local_428);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            (&local_478,NoTrans,4,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4a8,0);
  memcpy(local_3b8,&DAT_004607d0,0x100);
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&local_468,
             local_3b8,local_2b8);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4a8,
             &local_468);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4a8,
             &local_428);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            (&local_478,ConjTrans,4,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4a8,0);
  memcpy(local_3b8,&DAT_004608d0,0x100);
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&local_468,
             local_3b8,local_2b8);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4a8,
             &local_468);
  if (local_468.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_468.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_468.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_468.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_4a8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_4a8,(long)local_498 - (long)local_4a8);
  }
  if (local_4d8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_4d8,(long)local_4c8 - (long)local_4d8);
  }
  if (local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_490.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_490.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_490.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_4c0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_4c0,(long)local_4b0 - (long)local_4c0);
  }
  if (local_4f8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_4f8,local_4e8._M_allocated_capacity - (long)local_4f8);
  }
  local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)&PTR_nbQubits_004ee7a0;
  local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x200000000;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4f8,
             &local_410);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)&local_490,NoTrans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4f8,0);
  puVar5 = &DAT_004609d0;
  pcVar11 = (iterator)local_3b8;
  for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
    *(undefined8 *)pcVar11->_M_value = *puVar5;
    puVar5 = puVar5 + (ulong)bVar14 * -2 + 1;
    pcVar11 = (iterator)(pcVar11[-(ulong)bVar14]._M_value + 8);
  }
  __l_12._M_len = 8;
  __l_12._M_array = (iterator)local_3b8;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4c0,
             __l_12,(allocator_type *)local_4d8);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4f8,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4c0);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4f8,
             &local_410);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)&local_490,ConjTrans,3,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4f8,0);
  puVar5 = &DAT_00460a50;
  puVar6 = (undefined8 *)local_3b8;
  for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar6 = *puVar5;
    puVar5 = puVar5 + (ulong)bVar14 * -2 + 1;
    puVar6 = puVar6 + (ulong)bVar14 * -2 + 1;
  }
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)local_4c0,
             local_3b8,local_338);
  test_qclab_qgates_iSWAP_check<std::complex<double>>
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4f8,
             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_4c0);
  if (local_4c0 != (undefined1  [8])0x0) {
    operator_delete((void *)local_4c0,(long)local_4b0 - (long)local_4c0);
  }
  if (local_4f8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_4f8,local_4e8._M_allocated_capacity - (long)local_4f8);
  }
  local_3b8 = (undefined1  [8])&PTR_nbQubits_004ee7a0;
  aStack_3b0._M_elems[0] = 0;
  aStack_3b0._M_elems[1] = 1;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_4f8,&local_50);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)local_3b8,Left,NoTrans,2,
             (SquareMatrix<std::complex<double>_> *)local_4f8,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_78,(SquareMatrix<std::complex<double>_> *)local_4f8);
  local_88.size_ = 4;
  local_88.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )operator_new__(0x100);
  *(undefined8 *)
   local_88.data_._M_t.
   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
   super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl = 0x3ff0000000000000;
  *(undefined8 *)
   ((long)local_88.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 8) = 0;
  *(undefined8 *)
   ((long)local_88.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined8 *)
   ((long)local_88.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x18) = 0;
  *(undefined8 *)
   ((long)local_88.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x20) = 0;
  *(undefined8 *)
   ((long)local_88.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x28) = 0;
  *(undefined8 *)
   ((long)local_88.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined8 *)
   ((long)local_88.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x38) = 0;
  *(undefined8 *)
   ((long)local_88.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x40) = 0;
  *(undefined8 *)
   ((long)local_88.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x48) = 0;
  *(undefined8 *)
   ((long)local_88.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x50) = 0;
  *(undefined8 *)
   ((long)local_88.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x58) = 0;
  *(undefined8 *)
   ((long)local_88.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x60) = 0;
  *(undefined8 *)
   ((long)local_88.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x68) =
       0x3ff0000000000000;
  *(undefined8 *)
   ((long)local_88.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x70) = 0;
  *(undefined8 *)
   ((long)local_88.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x78) = 0;
  *(undefined8 *)
   ((long)local_88.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x80) = 0;
  *(undefined8 *)
   ((long)local_88.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x88) = 0;
  *(undefined8 *)
   ((long)local_88.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x90) = 0;
  *(undefined8 *)
   ((long)local_88.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x98) =
       0x3ff0000000000000;
  *(undefined8 *)
   ((long)local_88.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xa0) = 0;
  *(undefined8 *)
   ((long)local_88.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xa8) = 0;
  *(undefined8 *)
   ((long)local_88.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xb0) = 0;
  *(undefined8 *)
   ((long)local_88.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xb8) = 0;
  *(undefined8 *)
   ((long)local_88.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xc0) = 0;
  *(undefined8 *)
   ((long)local_88.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 200) = 0;
  *(undefined8 *)
   ((long)local_88.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xd0) = 0;
  *(undefined8 *)
   ((long)local_88.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xd8) = 0;
  *(undefined8 *)
   ((long)local_88.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xe0) = 0;
  *(undefined8 *)
   ((long)local_88.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xe8) = 0;
  *(undefined8 *)
   ((long)local_88.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xf0) =
       0x3ff0000000000000;
  *(undefined8 *)
   ((long)local_88.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xf8) = 0;
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_78,&local_88);
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_88.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl != (complex<double> *)0x0) {
    operator_delete__((void *)local_88.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_88.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  if (local_78.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0) {
    operator_delete__((void *)local_78.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_78.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  local_4c0 = (undefined1  [8])&DAT_00000004;
  local_4b8._M_head_impl = (complex<double> *)operator_new__(0x100);
  *(undefined8 *)local_4b8._M_head_impl = 0x3ff0000000000000;
  ((pointer)((long)local_4b8._M_head_impl + 8))[0] = 0;
  ((pointer)((long)local_4b8._M_head_impl + 8))[1] = 0;
  *(undefined1 **)((pointer)((long)local_4b8._M_head_impl + 0x10))->_M_value = &DAT_4014000000000000
  ;
  ((pointer)((long)local_4b8._M_head_impl + 0x18))[0] = 0;
  ((pointer)((long)local_4b8._M_head_impl + 0x18))[1] = 0;
  *(undefined1 **)((pointer)((long)local_4b8._M_head_impl + 0x20))->_M_value = &DAT_4022000000000000
  ;
  ((pointer)((long)local_4b8._M_head_impl + 0x28))[0] = 0;
  ((pointer)((long)local_4b8._M_head_impl + 0x28))[1] = 0;
  *(undefined1 **)((pointer)((long)local_4b8._M_head_impl + 0x30))->_M_value = &DAT_402a000000000000
  ;
  ((pointer)((long)local_4b8._M_head_impl + 0x38))[0] = 0;
  ((pointer)((long)local_4b8._M_head_impl + 0x38))[1] = 0;
  *(int *)(((pointer)((long)local_4b8._M_head_impl + 0x40))->_M_value + 0) = 0;
  *(int *)(((pointer)((long)local_4b8._M_head_impl + 0x40))->_M_value + 4) = 0x40000000;
  ((pointer)((long)local_4b8._M_head_impl + 0x48))[0] = 0;
  ((pointer)((long)local_4b8._M_head_impl + 0x48))[1] = 0;
  *(undefined1 **)((pointer)((long)local_4b8._M_head_impl + 0x50))->_M_value = &DAT_4018000000000000
  ;
  ((pointer)((long)local_4b8._M_head_impl + 0x58))[0] = 0;
  ((pointer)((long)local_4b8._M_head_impl + 0x58))[1] = 0;
  *(undefined1 **)((pointer)((long)local_4b8._M_head_impl + 0x60))->_M_value = &DAT_4024000000000000
  ;
  ((pointer)((long)local_4b8._M_head_impl + 0x68))[0] = 0;
  ((pointer)((long)local_4b8._M_head_impl + 0x68))[1] = 0;
  *(undefined1 **)((pointer)((long)local_4b8._M_head_impl + 0x70))->_M_value = &DAT_402c000000000000
  ;
  ((pointer)((long)local_4b8._M_head_impl + 0x78))[0] = 0;
  ((pointer)((long)local_4b8._M_head_impl + 0x78))[1] = 0;
  *(undefined1 **)((pointer)((long)local_4b8._M_head_impl + 0x80))->_M_value = &DAT_4008000000000000
  ;
  ((pointer)((long)local_4b8._M_head_impl + 0x88))[0] = 0;
  ((pointer)((long)local_4b8._M_head_impl + 0x88))[1] = 0;
  *(undefined1 **)((pointer)((long)local_4b8._M_head_impl + 0x90))->_M_value = &DAT_401c000000000000
  ;
  ((pointer)((long)local_4b8._M_head_impl + 0x98))[0] = 0;
  ((pointer)((long)local_4b8._M_head_impl + 0x98))[1] = 0;
  *(undefined1 **)((pointer)((long)local_4b8._M_head_impl + 0xa0))->_M_value = &DAT_4026000000000000
  ;
  ((pointer)((long)local_4b8._M_head_impl + 0xa8))[0] = 0;
  ((pointer)((long)local_4b8._M_head_impl + 0xa8))[1] = 0;
  *(undefined1 **)((pointer)((long)local_4b8._M_head_impl + 0xb0))->_M_value = &DAT_402e000000000000
  ;
  ((pointer)((long)local_4b8._M_head_impl + 0xb8))[0] = 0;
  ((pointer)((long)local_4b8._M_head_impl + 0xb8))[1] = 0;
  *(undefined1 **)((pointer)((long)local_4b8._M_head_impl + 0xc0))->_M_value = &DAT_4010000000000000
  ;
  ((pointer)((long)local_4b8._M_head_impl + 200))[0] = 0;
  ((pointer)((long)local_4b8._M_head_impl + 200))[1] = 0;
  *(undefined1 **)((pointer)((long)local_4b8._M_head_impl + 0xd0))->_M_value = &DAT_4020000000000000
  ;
  ((pointer)((long)local_4b8._M_head_impl + 0xd8))[0] = 0;
  ((pointer)((long)local_4b8._M_head_impl + 0xd8))[1] = 0;
  *(undefined1 **)((pointer)((long)local_4b8._M_head_impl + 0xe0))->_M_value = &DAT_4028000000000000
  ;
  ((pointer)((long)local_4b8._M_head_impl + 0xe8))[0] = 0;
  ((pointer)((long)local_4b8._M_head_impl + 0xe8))[1] = 0;
  *(undefined1 **)((pointer)((long)local_4b8._M_head_impl + 0xf0))->_M_value = &DAT_4030000000000000
  ;
  ((pointer)((long)local_4b8._M_head_impl + 0xf8))[0] = 0;
  ((pointer)((long)local_4b8._M_head_impl + 0xf8))[1] = 0;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_4f8,
             (SquareMatrix<std::complex<double>_> *)local_4c0);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)local_3b8,Left,NoTrans,2,
             (SquareMatrix<std::complex<double>_> *)local_4f8,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_98,(SquareMatrix<std::complex<double>_> *)local_4f8);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_3c8,(SquareMatrix<std::complex<double>_> *)local_4c0);
  local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)&DAT_00000004;
  local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)operator_new__(0x100);
  *(undefined8 *)
   local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
   _M_impl.super__Vector_impl_data._M_finish = 0x3ff0000000000000;
  *(undefined8 *)
   ((long)local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + 8) = 0;
  *(undefined8 *)
   ((pointer)
   ((long)local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + 0x10))->_M_value = 0;
  *(undefined8 *)
   ((long)local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + 0x18) = 0;
  *(undefined8 *)
   ((pointer)
   ((long)local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + 0x20))->_M_value = 0;
  *(undefined8 *)
   ((long)local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + 0x28) = 0;
  *(undefined8 *)
   ((pointer)
   ((long)local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + 0x30))->_M_value = 0;
  *(undefined8 *)
   ((long)local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + 0x38) = 0;
  *(undefined8 *)
   ((pointer)
   ((long)local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + 0x40))->_M_value = 0;
  *(undefined8 *)
   ((long)local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + 0x48) = 0;
  *(undefined8 *)
   ((pointer)
   ((long)local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + 0x50))->_M_value = 0;
  *(undefined8 *)
   ((long)local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + 0x58) = 0;
  *(undefined8 *)
   ((pointer)
   ((long)local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + 0x60))->_M_value = 0;
  *(undefined8 *)
   ((long)local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + 0x68) = 0x3ff0000000000000;
  *(undefined8 *)
   ((pointer)
   ((long)local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + 0x70))->_M_value = 0;
  *(undefined8 *)
   ((long)local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + 0x78) = 0;
  *(undefined8 *)
   ((pointer)
   ((long)local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + 0x80))->_M_value = 0;
  *(undefined8 *)
   ((long)local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + 0x88) = 0;
  *(undefined8 *)
   ((pointer)
   ((long)local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + 0x90))->_M_value = 0;
  *(undefined8 *)
   ((long)local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + 0x98) = 0x3ff0000000000000;
  *(undefined8 *)
   ((pointer)
   ((long)local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + 0xa0))->_M_value = 0;
  *(undefined8 *)
   ((long)local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + 0xa8) = 0;
  *(undefined8 *)
   ((pointer)
   ((long)local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + 0xb0))->_M_value = 0;
  *(undefined8 *)
   ((long)local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + 0xb8) = 0;
  *(undefined8 *)
   ((pointer)
   ((long)local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + 0xc0))->_M_value = 0;
  *(undefined8 *)
   ((long)local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + 200) = 0;
  *(undefined8 *)
   ((pointer)
   ((long)local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + 0xd0))->_M_value = 0;
  *(undefined8 *)
   ((long)local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + 0xd8) = 0;
  *(undefined8 *)
   ((pointer)
   ((long)local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + 0xe0))->_M_value = 0;
  *(undefined8 *)
   ((long)local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + 0xe8) = 0;
  *(undefined8 *)
   ((pointer)
   ((long)local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + 0xf0))->_M_value = 0x3ff0000000000000;
  *(undefined8 *)
   ((long)local_490.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
          ._M_impl.super__Vector_impl_data._M_finish + 0xf8) = 0;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator*=
            (&local_3c8,(SquareMatrix<std::complex<double>_> *)&local_490);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix(&local_a8,&local_3c8);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_98,&local_a8);
  if (local_a8.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0) {
    operator_delete__((void *)local_a8.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_a8.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  if ((_Type)local_490.
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish != (_Type)0x0) {
    operator_delete__(local_490.
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_3c8.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl != (complex<double> *)0x0) {
    operator_delete__((void *)local_3c8.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_3c8.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_98.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl != (complex<double> *)0x0) {
    operator_delete__((void *)local_98.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_98.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_4f8,
             (SquareMatrix<std::complex<double>_> *)local_4c0);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)local_3b8,Right,NoTrans,2,
             (SquareMatrix<std::complex<double>_> *)local_4f8,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_b8,(SquareMatrix<std::complex<double>_> *)local_4f8);
  local_3d8.size_ = 4;
  local_3d8.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )operator_new__(0x100);
  *(undefined8 *)
   local_3d8.data_._M_t.
   super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
   super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
   super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl = 0x3ff0000000000000;
  *(undefined8 *)
   ((long)local_3d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 8) = 0;
  *(undefined8 *)
   ((long)local_3d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined8 *)
   ((long)local_3d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x18) = 0;
  *(undefined8 *)
   ((long)local_3d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x20) = 0;
  *(undefined8 *)
   ((long)local_3d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x28) = 0;
  *(undefined8 *)
   ((long)local_3d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x30) = 0;
  *(undefined8 *)
   ((long)local_3d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x38) = 0;
  *(undefined8 *)
   ((long)local_3d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x40) = 0;
  *(undefined8 *)
   ((long)local_3d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x48) = 0;
  *(undefined8 *)
   ((long)local_3d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x50) = 0;
  *(undefined8 *)
   ((long)local_3d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x58) = 0;
  *(undefined8 *)
   ((long)local_3d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x60) = 0;
  *(undefined8 *)
   ((long)local_3d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x68) =
       0x3ff0000000000000;
  *(undefined8 *)
   ((long)local_3d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x70) = 0;
  *(undefined8 *)
   ((long)local_3d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x78) = 0;
  *(undefined8 *)
   ((long)local_3d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x80) = 0;
  *(undefined8 *)
   ((long)local_3d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x88) = 0;
  *(undefined8 *)
   ((long)local_3d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x90) = 0;
  *(undefined8 *)
   ((long)local_3d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0x98) =
       0x3ff0000000000000;
  *(undefined8 *)
   ((long)local_3d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xa0) = 0;
  *(undefined8 *)
   ((long)local_3d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xa8) = 0;
  *(undefined8 *)
   ((long)local_3d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xb0) = 0;
  *(undefined8 *)
   ((long)local_3d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xb8) = 0;
  *(undefined8 *)
   ((long)local_3d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xc0) = 0;
  *(undefined8 *)
   ((long)local_3d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 200) = 0;
  *(undefined8 *)
   ((long)local_3d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xd0) = 0;
  *(undefined8 *)
   ((long)local_3d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xd8) = 0;
  *(undefined8 *)
   ((long)local_3d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xe0) = 0;
  *(undefined8 *)
   ((long)local_3d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xe8) = 0;
  *(undefined8 *)
   ((long)local_3d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xf0) =
       0x3ff0000000000000;
  *(undefined8 *)
   ((long)local_3d8.data_._M_t.
          super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
          .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl + 0xf8) = 0;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator*=
            (&local_3d8,(SquareMatrix<std::complex<double>_> *)local_4c0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix(&local_c8,&local_3d8);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_b8,&local_c8);
  if (local_c8.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0) {
    operator_delete__((void *)local_c8.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_c8.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  if (local_3d8.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0) {
    operator_delete__((void *)local_3d8.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_3d8.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  if ((tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_b8.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (_Head_base<0UL,_std::complex<double>_*,_false>)0x0) {
    operator_delete__((void *)local_b8.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_b8.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  local_4d8 = (undefined1  [8])&DAT_00000004;
  local_4d0._M_head_impl = (complex<double> *)operator_new__(0x100);
  *(undefined8 *)(local_4d0._M_head_impl)->_M_value = 0x3ff0000000000000;
  *(undefined8 *)((long)(local_4d0._M_head_impl)->_M_value + 8) = 0;
  *(undefined8 *)local_4d0._M_head_impl[1]._M_value = 0;
  *(undefined8 *)(local_4d0._M_head_impl[1]._M_value + 8) = 0;
  *(undefined8 *)local_4d0._M_head_impl[2]._M_value = 0;
  *(undefined8 *)(local_4d0._M_head_impl[2]._M_value + 8) = 0;
  *(undefined8 *)local_4d0._M_head_impl[3]._M_value = 0;
  *(undefined8 *)(local_4d0._M_head_impl[3]._M_value + 8) = 0;
  *(undefined8 *)local_4d0._M_head_impl[4]._M_value = 0;
  *(undefined8 *)(local_4d0._M_head_impl[4]._M_value + 8) = 0;
  *(undefined8 *)local_4d0._M_head_impl[5]._M_value = 0;
  *(undefined8 *)(local_4d0._M_head_impl[5]._M_value + 8) = 0;
  *(undefined8 *)local_4d0._M_head_impl[6]._M_value = 0;
  *(undefined8 *)(local_4d0._M_head_impl[6]._M_value + 8) = 0x3ff0000000000000;
  *(undefined8 *)local_4d0._M_head_impl[7]._M_value = 0;
  *(undefined8 *)(local_4d0._M_head_impl[7]._M_value + 8) = 0;
  *(undefined8 *)local_4d0._M_head_impl[8]._M_value = 0;
  *(undefined8 *)(local_4d0._M_head_impl[8]._M_value + 8) = 0;
  *(undefined8 *)local_4d0._M_head_impl[9]._M_value = 0;
  *(undefined8 *)(local_4d0._M_head_impl[9]._M_value + 8) = 0x3ff0000000000000;
  *(undefined8 *)local_4d0._M_head_impl[10]._M_value = 0;
  *(undefined8 *)(local_4d0._M_head_impl[10]._M_value + 8) = 0;
  *(undefined8 *)local_4d0._M_head_impl[0xb]._M_value = 0;
  *(undefined8 *)(local_4d0._M_head_impl[0xb]._M_value + 8) = 0;
  *(undefined8 *)local_4d0._M_head_impl[0xc]._M_value = 0;
  *(undefined8 *)(local_4d0._M_head_impl[0xc]._M_value + 8) = 0;
  *(undefined8 *)local_4d0._M_head_impl[0xd]._M_value = 0;
  *(undefined8 *)(local_4d0._M_head_impl[0xd]._M_value + 8) = 0;
  *(undefined8 *)local_4d0._M_head_impl[0xe]._M_value = 0;
  *(undefined8 *)(local_4d0._M_head_impl[0xe]._M_value + 8) = 0;
  *(undefined8 *)local_4d0._M_head_impl[0xf]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(local_4d0._M_head_impl[0xf]._M_value + 8) = 0;
  qclab::dense::conjTrans<qclab::dense::SquareMatrix<std::complex<double>>>
            ((dense *)&local_490,(SquareMatrix<std::complex<double>_> *)local_4d8);
  if (local_4d0._M_head_impl != (pointer)0x0) {
    operator_delete__(local_4d0._M_head_impl);
  }
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_4f8,
             (SquareMatrix<std::complex<double>_> *)local_4c0);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)local_3b8,Left,ConjTrans,2,
             (SquareMatrix<std::complex<double>_> *)local_4f8,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_d8,(SquareMatrix<std::complex<double>_> *)local_4f8);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_3e8,(SquareMatrix<std::complex<double>_> *)local_4c0);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator*=
            (&local_3e8,(SquareMatrix<std::complex<double>_> *)&local_490);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix(&local_e8,&local_3e8);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_d8,&local_e8);
  if ((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)
      local_e8.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0) {
    operator_delete__((void *)local_e8.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_e8.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  if ((_Head_base<0UL,_std::complex<double>_*,_false>)
      local_3e8.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (_Head_base<0UL,_std::complex<double>_*,_false>)0x0) {
    operator_delete__((void *)local_3e8.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_3e8.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_d8.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl != (complex<double> *)0x0) {
    operator_delete__((void *)local_d8.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_d8.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_4f8,
             (SquareMatrix<std::complex<double>_> *)local_4c0);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)local_3b8,Right,ConjTrans,2,
             (SquareMatrix<std::complex<double>_> *)local_4f8,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_f8,(SquareMatrix<std::complex<double>_> *)local_4f8);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_3f8,(SquareMatrix<std::complex<double>_> *)&local_490);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator*=
            (&local_3f8,(SquareMatrix<std::complex<double>_> *)local_4c0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix(&local_108,&local_3f8);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_f8,&local_108);
  if (local_108.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0) {
    operator_delete__((void *)local_108.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_108.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  if ((tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_3f8.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (_Head_base<0UL,_std::complex<double>_*,_false>)0x0) {
    operator_delete__((void *)local_3f8.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_3f8.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  if ((tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_f8.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (_Head_base<0UL,_std::complex<double>_*,_false>)0x0) {
    operator_delete__((void *)local_f8.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_f8.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_4d8,&local_448);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)local_3b8,Left,NoTrans,3,
             (SquareMatrix<std::complex<double>_> *)local_4d8,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_118,(SquareMatrix<std::complex<double>_> *)local_4d8);
  local_4a8 = (undefined1  [8])&DAT_00000004;
  local_4a0._M_head_impl = (complex<double> *)operator_new__(0x100);
  *(undefined8 *)(local_4a0._M_head_impl)->_M_value = 0x3ff0000000000000;
  *(undefined8 *)((long)(local_4a0._M_head_impl)->_M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[1]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[1]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[2]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[2]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[3]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[3]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[4]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[4]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[5]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[5]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[6]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[6]._M_value + 8) = 0x3ff0000000000000;
  *(undefined8 *)local_4a0._M_head_impl[7]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[7]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[8]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[8]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[9]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[9]._M_value + 8) = 0x3ff0000000000000;
  *(undefined8 *)local_4a0._M_head_impl[10]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[10]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[0xb]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[0xb]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[0xc]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[0xc]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[0xd]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[0xd]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[0xe]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[0xe]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[0xf]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(local_4a0._M_head_impl[0xf]._M_value + 8) = 0;
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_128,(SquareMatrix<std::complex<double>_> *)local_4a8,&local_438);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_118,&local_128);
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_128.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl != (complex<double> *)0x0) {
    operator_delete__((void *)local_128.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_128.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_4a0._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(local_4a0._M_head_impl);
  }
  if (local_118.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0) {
    operator_delete__((void *)local_118.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_118.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_4d8,&local_448);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)local_3b8,Right,NoTrans,3,
             (SquareMatrix<std::complex<double>_> *)local_4d8,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_138,(SquareMatrix<std::complex<double>_> *)local_4d8);
  local_4a8 = (undefined1  [8])&DAT_00000004;
  local_4a0._M_head_impl = (complex<double> *)operator_new__(0x100);
  *(undefined8 *)(local_4a0._M_head_impl)->_M_value = 0x3ff0000000000000;
  *(undefined8 *)((long)(local_4a0._M_head_impl)->_M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[1]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[1]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[2]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[2]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[3]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[3]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[4]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[4]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[5]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[5]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[6]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[6]._M_value + 8) = 0x3ff0000000000000;
  *(undefined8 *)local_4a0._M_head_impl[7]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[7]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[8]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[8]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[9]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[9]._M_value + 8) = 0x3ff0000000000000;
  *(undefined8 *)local_4a0._M_head_impl[10]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[10]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[0xb]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[0xb]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[0xc]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[0xc]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[0xd]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[0xd]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[0xe]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[0xe]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[0xf]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(local_4a0._M_head_impl[0xf]._M_value + 8) = 0;
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_148,(SquareMatrix<std::complex<double>_> *)local_4a8,&local_438);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_138,&local_148);
  if (local_148.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0) {
    operator_delete__((void *)local_148.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_148.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_4a0._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(local_4a0._M_head_impl);
  }
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_138.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl != (complex<double> *)0x0) {
    operator_delete__((void *)local_138.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_138.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_4d8,&local_448);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)local_3b8,Left,ConjTrans,3,
             (SquareMatrix<std::complex<double>_> *)local_4d8,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_158,(SquareMatrix<std::complex<double>_> *)local_4d8);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_168,(SquareMatrix<std::complex<double>_> *)&local_490,&local_438);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_158,&local_168);
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_168.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl != (complex<double> *)0x0) {
    operator_delete__((void *)local_168.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_168.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  if ((_Head_base<0UL,_std::complex<double>_*,_false>)
      local_158.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (_Head_base<0UL,_std::complex<double>_*,_false>)0x0) {
    operator_delete__((void *)local_158.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_158.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_4d8,&local_448);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)local_3b8,Right,ConjTrans,3,
             (SquareMatrix<std::complex<double>_> *)local_4d8,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_178,(SquareMatrix<std::complex<double>_> *)local_4d8);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_188,(SquareMatrix<std::complex<double>_> *)&local_490,&local_438);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_178,&local_188);
  if ((_Head_base<0UL,_std::complex<double>_*,_false>)
      local_188.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (_Head_base<0UL,_std::complex<double>_*,_false>)0x0) {
    operator_delete__((void *)local_188.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_188.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  if (local_178.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0) {
    operator_delete__((void *)local_178.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_178.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  aStack_3b0._M_elems[0] = 1;
  aStack_3b0._M_elems[1] = 2;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_4d8,&local_448);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)local_3b8,Left,NoTrans,3,
             (SquareMatrix<std::complex<double>_> *)local_4d8,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_198,(SquareMatrix<std::complex<double>_> *)local_4d8);
  local_4a8 = (undefined1  [8])&DAT_00000004;
  local_4a0._M_head_impl = (complex<double> *)operator_new__(0x100);
  *(undefined8 *)(local_4a0._M_head_impl)->_M_value = 0x3ff0000000000000;
  *(undefined8 *)((long)(local_4a0._M_head_impl)->_M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[1]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[1]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[2]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[2]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[3]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[3]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[4]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[4]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[5]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[5]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[6]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[6]._M_value + 8) = 0x3ff0000000000000;
  *(undefined8 *)local_4a0._M_head_impl[7]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[7]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[8]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[8]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[9]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[9]._M_value + 8) = 0x3ff0000000000000;
  *(undefined8 *)local_4a0._M_head_impl[10]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[10]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[0xb]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[0xb]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[0xc]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[0xc]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[0xd]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[0xd]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[0xe]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[0xe]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[0xf]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(local_4a0._M_head_impl[0xf]._M_value + 8) = 0;
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_1a8,&local_438,(SquareMatrix<std::complex<double>_> *)local_4a8);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_198,&local_1a8);
  if (local_1a8.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0) {
    operator_delete__((void *)local_1a8.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_1a8.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_4a0._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(local_4a0._M_head_impl);
  }
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_198.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl != (complex<double> *)0x0) {
    operator_delete__((void *)local_198.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_198.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_4d8,&local_448);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)local_3b8,Right,NoTrans,3,
             (SquareMatrix<std::complex<double>_> *)local_4d8,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_1b8,(SquareMatrix<std::complex<double>_> *)local_4d8);
  local_4a8 = (undefined1  [8])&DAT_00000004;
  local_4a0._M_head_impl = (complex<double> *)operator_new__(0x100);
  *(undefined8 *)(local_4a0._M_head_impl)->_M_value = 0x3ff0000000000000;
  *(undefined8 *)((long)(local_4a0._M_head_impl)->_M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[1]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[1]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[2]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[2]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[3]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[3]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[4]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[4]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[5]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[5]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[6]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[6]._M_value + 8) = 0x3ff0000000000000;
  *(undefined8 *)local_4a0._M_head_impl[7]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[7]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[8]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[8]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[9]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[9]._M_value + 8) = 0x3ff0000000000000;
  *(undefined8 *)local_4a0._M_head_impl[10]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[10]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[0xb]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[0xb]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[0xc]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[0xc]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[0xd]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[0xd]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[0xe]._M_value = 0;
  *(undefined8 *)(local_4a0._M_head_impl[0xe]._M_value + 8) = 0;
  *(undefined8 *)local_4a0._M_head_impl[0xf]._M_value = 0x3ff0000000000000;
  *(undefined8 *)(local_4a0._M_head_impl[0xf]._M_value + 8) = 0;
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_1c8,&local_438,(SquareMatrix<std::complex<double>_> *)local_4a8);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_1b8,&local_1c8);
  if ((_Head_base<0UL,_std::complex<double>_*,_false>)
      local_1c8.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (_Head_base<0UL,_std::complex<double>_*,_false>)0x0) {
    operator_delete__((void *)local_1c8.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_1c8.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_4a0._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(local_4a0._M_head_impl);
  }
  if (local_1b8.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0) {
    operator_delete__((void *)local_1b8.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_1b8.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_4d8,&local_448);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)local_3b8,Left,ConjTrans,3,
             (SquareMatrix<std::complex<double>_> *)local_4d8,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_1d8,(SquareMatrix<std::complex<double>_> *)local_4d8);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_1e8,&local_438,(SquareMatrix<std::complex<double>_> *)&local_490);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_1d8,&local_1e8);
  if ((__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)
      local_1e8.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0) {
    operator_delete__((void *)local_1e8.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_1e8.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  if ((tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_1d8.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (_Head_base<0UL,_std::complex<double>_*,_false>)0x0) {
    operator_delete__((void *)local_1d8.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_1d8.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)local_4d8,&local_448);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)local_3b8,Right,ConjTrans,3,
             (SquareMatrix<std::complex<double>_> *)local_4d8,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_1f8,(SquareMatrix<std::complex<double>_> *)local_4d8);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&local_208,&local_438,(SquareMatrix<std::complex<double>_> *)&local_490);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_1f8,&local_208);
  if ((tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_208.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (_Head_base<0UL,_std::complex<double>_*,_false>)0x0) {
    operator_delete__((void *)local_208.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_208.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_1f8.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl != (complex<double> *)0x0) {
    operator_delete__((void *)local_1f8.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_1f8.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  if (local_4d0._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(local_4d0._M_head_impl);
  }
  if ((_Type)local_490.
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish != (_Type)0x0) {
    operator_delete__(local_490.
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_4b8._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(local_4b8._M_head_impl);
  }
  if (local_4f0._M_elems != (_Type)0x0) {
    operator_delete__((void *)local_4f0._M_elems);
  }
  local_3b8 = (undefined1  [8])&PTR_nbQubits_004ee7a0;
  aStack_3b0._M_elems[0] = 0;
  aStack_3b0._M_elems[1] = 2;
  local_4f8 = (undefined1  [8])0x8;
  aiVar7 = (_Type)operator_new__(0x400);
  memset((undefined8 *)((long)aiVar7 + 0x10),0,0x3f0);
  *(undefined8 *)aiVar7 = 0x3ff0000000000000;
  *(undefined8 *)((long)aiVar7 + 8) = 0;
  *(undefined8 *)((long)aiVar7 + 200) = 0x3ff0000000000000;
  *(undefined8 *)((long)aiVar7 + 0x120) = 0x3ff0000000000000;
  puVar5 = (undefined8 *)((long)aiVar7 + 0x60) + (long)local_4f8 * 6;
  *(undefined4 *)puVar5 = 0;
  *(undefined4 *)((long)puVar5 + 4) = 0;
  *(undefined4 *)(puVar5 + 1) = 0;
  *(undefined4 *)((long)puVar5 + 0xc) = 0x3ff00000;
  puVar5 = (undefined8 *)((long)aiVar7 + 0x10) + (long)local_4f8 * 8;
  *(undefined4 *)puVar5 = 0;
  *(undefined4 *)((long)puVar5 + 4) = 0;
  *(undefined4 *)(puVar5 + 1) = 0;
  *(undefined4 *)((long)puVar5 + 0xc) = 0x3ff00000;
  ((undefined8 *)((long)aiVar7 + 0x50))[(long)local_4f8 * 10] = 0x3ff0000000000000;
  ((undefined8 *)((long)aiVar7 + 0x50) + (long)local_4f8 * 10)[1] = 0;
  puVar5 = (undefined8 *)((long)aiVar7 + 0x30) + (long)local_4f8 * 0xc;
  *(undefined4 *)puVar5 = 0;
  *(undefined4 *)((long)puVar5 + 4) = 0;
  *(undefined4 *)(puVar5 + 1) = 0;
  *(undefined4 *)((long)puVar5 + 0xc) = 0x3ff00000;
  ((undefined8 *)((long)aiVar7 + 0x70))[(long)local_4f8 * 0xe] = 0x3ff0000000000000;
  ((undefined8 *)((long)aiVar7 + 0x70) + (long)local_4f8 * 0xe)[1] = 0;
  local_4f0._M_elems = aiVar7;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_4c0,&local_448);
  qclab::qgates::iSWAP<std::complex<double>_>::apply
            ((iSWAP<std::complex<double>_> *)local_3b8,Left,NoTrans,3,
             (SquareMatrix<std::complex<double>_> *)local_4c0,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_218,(SquareMatrix<std::complex<double>_> *)local_4c0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            (&local_228,(SquareMatrix<std::complex<double>_> *)local_4f8);
  test_qclab_qgates_iSWAP_check<qclab::dense::SquareMatrix<std::complex<double>>>
            (&local_218,&local_228);
  if ((_Head_base<0UL,_std::complex<double>_*,_false>)
      local_228.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (_Head_base<0UL,_std::complex<double>_*,_false>)0x0) {
    operator_delete__((void *)local_228.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_228.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  if (local_218.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0) {
    operator_delete__((void *)local_218.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  local_218.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0;
  if (local_4b8._M_head_impl != (complex<double> *)0x0) {
    operator_delete__(local_4b8._M_head_impl);
  }
  if (local_4f0._M_elems != (_Type)0x0) {
    operator_delete__((void *)local_4f0._M_elems);
  }
  if (local_428.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_428.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_428.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_428.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_410.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_410.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_410.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_410.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_38 != (void *)0x0) {
    operator_delete__(local_38);
  }
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_448.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl != (complex<double> *)0x0) {
    operator_delete__((void *)local_448.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  if ((_Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
      local_50.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl != (complex<double> *)0x0) {
    operator_delete__((void *)local_50.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  if (local_438.data_._M_t.
      super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t
      .super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>)0x0) {
    operator_delete__((void *)local_438.data_._M_t.
                              super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                              .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void test_qclab_qgates_iSWAP() {

  const auto I1 = qclab::dense::eye< T >(  2 ) ;
  const auto I2 = qclab::dense::eye< T >(  4 ) ;
  const auto I3 = qclab::dense::eye< T >(  8 ) ;
  const auto I4 = qclab::dense::eye< T >( 16 ) ;

  using V = std::vector< T > ;
  const V v2 = { 3 , 5 , 2 , 7 } ;
  const V v3 = { 3 , 5 , 2 , 7 , 4 , 1 , 8 , 3 } ;
  const V v4 = { 3 , 5 , 2 , 7 , 4 , 1 , 8 , 3 , 7 , 2 , 5 , 6 , 8 , 9 , 5 , 1};

  {
    qclab::qgates::iSWAP< T >  iswap ;

    EXPECT_EQ( iswap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( iswap.fixed() ) ;        // fixed
    EXPECT_FALSE( iswap.controlled() ) ;  // controlled

    // qubit
    EXPECT_EQ( iswap.qubit() , 0 ) ;

    // qubits
    auto qubits = iswap.qubits() ;
    EXPECT_EQ( qubits.size() , 2 ) ;
    EXPECT_EQ( qubits[0] , 0 ) ;
    EXPECT_EQ( qubits[1] , 1 ) ;
    int qnew[] = { 3 , 5 } ;
    iswap.setQubits( &qnew[0] ) ;
    EXPECT_EQ( iswap.qubits()[0] , 3 ) ;
    EXPECT_EQ( iswap.qubits()[1] , 5 ) ;
    qnew[0] = 0 ;
    qnew[1] = 1 ;
    iswap.setQubits( &qnew[0] ) ;

    // matrix
    const T i(0,1) ;
    qclab::dense::SquareMatrix< T >  iSWAP_check( 1 , 0 , 0 , 0 ,
                                                  0 , 0 , i , 0 ,
                                                  0 , i , 0 , 0 ,
                                                  0 , 0 , 0 , 1 ) ;
    EXPECT_TRUE( iswap.matrix() == iSWAP_check ) ;

    // print
    iswap.print() ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( iswap.toQASM( qasm ) , 0 ) ;
    EXPECT_EQ( qasm.str() , "iswap q[0], q[1];\n" ) ;
    std::cout << qasm.str() ;

    // operators == and !=
    qclab::qgates::iSWAP< T >  iswap2( 2 , 4 ) ;
    EXPECT_TRUE(  iswap == iswap2 ) ;
    EXPECT_FALSE( iswap != iswap2 ) ;
  }

  {
    qclab::qgates::iSWAP< T >  iswap( 3 , 5 ) ;

    EXPECT_EQ( iswap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( iswap.fixed() ) ;        // fixed
    EXPECT_FALSE( iswap.controlled() ) ;  // controlled
    EXPECT_EQ( iswap.qubits()[0] , 3 ) ;  // qubit0
    EXPECT_EQ( iswap.qubits()[1] , 5 ) ;  // qubit1
  }

  {
    int qubits[] = { 3 , 5 } ;
    qclab::qgates::iSWAP< T >  iswap( &qubits[0] ) ;

    EXPECT_EQ( iswap.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_TRUE( iswap.fixed() ) ;        // fixed
    EXPECT_FALSE( iswap.controlled() ) ;  // controlled
    EXPECT_EQ( iswap.qubits()[0] , 3 ) ;  // qubit0
    EXPECT_EQ( iswap.qubits()[1] , 5 ) ;  // qubit1
  }

  {
    qclab::qgates::iSWAP< T >  iswap( 0 , 1 ) ;

    // apply (2 qubits)
    auto vec2 = v2 ;
    iswap.apply( qclab::Op::NoTrans , 2 , vec2 ) ;
    V check2 = { 3 , T(0,2) , T(0,5) , 7 } ;
    test_qclab_qgates_iSWAP_check( vec2 , check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ; T* vec2_ = vec2.data() ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { iswap.apply_device( qclab::Op::NoTrans , 2 , vec2_ ) ; }
    test_qclab_qgates_iSWAP_check( vec2 , check2 ) ;
  #endif
    vec2 = v2 ;
    iswap.apply( qclab::Op::ConjTrans , 2 , vec2 ) ;
    check2 = { 3 , T(0,-2) , T(0,-5) , 7 } ;
    test_qclab_qgates_iSWAP_check( vec2 , check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { iswap.apply_device( qclab::Op::ConjTrans , 2 , vec2_ ) ; }
    test_qclab_qgates_iSWAP_check( vec2 , check2 ) ;
  #endif

    // apply (3 qubits)
    auto vec3 = v3 ;
    iswap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    V check3 = { 3 , 5 , T(0,4) , T(0,1) , T(0,2) , T(0,7) , 8 , 3 } ;
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { iswap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #endif
    vec3 = v3 ;
    iswap.apply( qclab::Op::ConjTrans , 3 , vec3 ) ;
    check3 = { 3 , 5 , T(0,-4) , T(0,-1) , T(0,-2) , T(0,-7) , 8 , 3 } ;
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { iswap.apply_device( qclab::Op::ConjTrans , 3 , vec3_ ) ; }
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #endif

    int qnew[] = { 1 , 2 } ;
    iswap.setQubits( &qnew[0] ) ;
    vec3 = v3 ;
    iswap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    check3 = { 3 , T(0,2) , T(0,5) , 7 , 4 , T(0,8) , T(0,1) , 3 } ;
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { iswap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #endif
    vec3 = v3 ;
    iswap.apply( qclab::Op::ConjTrans , 3 , vec3 ) ;
    check3 = { 3 , T(0,-2) , T(0,-5) , 7 , 4 , T(0,-8) , T(0,-1) , 3 } ;
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { iswap.apply_device( qclab::Op::ConjTrans , 3 , vec3_ ) ; }
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #endif

    // apply (4 qubits)
    auto vec4 = v4 ;
    iswap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    V check4 = { 3 , 5 , T(0,4) , T(0,1) , T(0,2) , T(0,7) , 8 , 3 ,
                 7 , 2 , T(0,8) , T(0,9) , T(0,5) , T(0,6) , 5 , 1 } ;
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ; T* vec4_ = vec4.data() ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { iswap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #endif
    vec4 = v4 ;
    iswap.apply( qclab::Op::ConjTrans , 4 , vec4 ) ;
    check4 = { 3 , 5 , T(0,-4) , T(0,-1) , T(0,-2) , T(0,-7) , 8 , 3 ,
               7 , 2 , T(0,-8) , T(0,-9) , T(0,-5) , T(0,-6) , 5 , 1 } ;
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { iswap.apply_device( qclab::Op::ConjTrans , 4 , vec4_ ) ; }
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #endif

    qnew[0] = 0 ;
    qnew[1] = 1 ;
    iswap.setQubits( &qnew[0] ) ;
    vec4 = v4 ;
    iswap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    check4 = { 3 , 5 , 2 , 7 , T(0,7) , T(0,2) , T(0,5) , T(0,6) ,
               T(0,4) , T(0,1) , T(0,8) , T(0,3) , 8 , 9 , 5 , 1 } ;
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { iswap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #endif
    vec4 = v4 ;
    iswap.apply( qclab::Op::ConjTrans , 4 , vec4 ) ;
    check4 = { 3 , 5 , 2 , 7 , T(0,-7) , T(0,-2) , T(0,-5) , T(0,-6) ,
               T(0,-4) , T(0,-1) , T(0,-8) , T(0,-3) , 8 , 9 , 5 , 1 } ;
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { iswap.apply_device( qclab::Op::ConjTrans , 4 , vec4_ ) ; }
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #endif

    qnew[0] = 2 ;
    qnew[1] = 3 ;
    iswap.setQubits( &qnew[0] ) ;
    vec4 = v4 ;
    iswap.apply( qclab::Op::NoTrans , 4 , vec4 ) ;
    check4 = { 3 , T(0,2) , T(0,5) , 7 , 4 , T(0,8) , T(0,1) , 3 ,
               7 , T(0,5) , T(0,2) , 6 , 8 , T(0,5) , T(0,9) , 1 } ;
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { iswap.apply_device( qclab::Op::NoTrans , 4 , vec4_ ) ; }
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #endif
    vec4 = v4 ;
    iswap.apply( qclab::Op::ConjTrans , 4 , vec4 ) ;
    check4 = { 3 , T(0,-2) , T(0,-5) , 7 , 4 , T(0,-8) , T(0,-1) , 3 ,
               7 , T(0,-5) , T(0,-2) , 6 , 8 , T(0,-5) , T(0,-9) , 1 } ;
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec4 = v4 ;
    #pragma omp target data map(tofrom:vec4_[0:16])
    { iswap.apply_device( qclab::Op::ConjTrans , 4 , vec4_ ) ; }
    test_qclab_qgates_iSWAP_check( vec4 , check4 ) ;
  #endif
  }

  {
    qclab::qgates::iSWAP< T >  iswap( 0 , 2 ) ;

    // apply (3 qubits)
    auto vec3 = v3 ;
    iswap.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    V check3 = { 3 , T(0,4) , 2 , T(0,8) , T(0,5) , 1 , T(0,7) , 3 } ;
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { iswap.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #endif
    vec3 = v3 ;
    iswap.apply( qclab::Op::ConjTrans , 3 , vec3 ) ;
    check3 = { 3 , T(0,-4) , 2 , T(0,-8) , T(0,-5) , 1 , T(0,-7) , 3 } ;
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { iswap.apply_device( qclab::Op::ConjTrans , 3 , vec3_ ) ; }
    test_qclab_qgates_iSWAP_check( vec3 , check3 ) ;
  #endif
  }

  {
    qclab::qgates::iSWAP< T >  iswap( 0 , 1 ) ;

    // apply (2 qubits)
    auto mat2 = I2 ;
    iswap.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    test_qclab_qgates_iSWAP_check( mat2 , iswap.matrix() ) ;

    qclab::dense::SquareMatrix< T >  mat(  1 ,  2 ,  3 ,  4 ,
                                           5 ,  6 ,  7 ,  8 ,
                                           9 , 10 , 11 , 12 ,
                                          13 , 14 , 15 , 16 ) ;

    mat2 = mat ;
    iswap.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    test_qclab_qgates_iSWAP_check( mat2 , mat * iswap.matrix() ) ;

    mat2 = mat ;
    iswap.apply( qclab::Side::Right , qclab::Op::NoTrans , 2 , mat2 ) ;
    test_qclab_qgates_iSWAP_check( mat2 , iswap.matrix() * mat ) ;

    auto iswapH = qclab::dense::conjTrans( iswap.matrix() ) ;

    mat2 = mat ;
    iswap.apply( qclab::Side::Left , qclab::Op::ConjTrans , 2 , mat2 ) ;
    test_qclab_qgates_iSWAP_check( mat2 , mat * iswapH ) ;

    mat2 = mat ;
    iswap.apply( qclab::Side::Right , qclab::Op::ConjTrans , 2 , mat2 ) ;
    test_qclab_qgates_iSWAP_check( mat2 , iswapH * mat ) ;

    // apply (3 qubits)
    auto mat3 = I3 ;
    iswap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 ,
                                   qclab::dense::kron( iswap.matrix() , I1 ) ) ;

    mat3 = I3 ;
    iswap.apply( qclab::Side::Right , qclab::Op::NoTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 ,
                                   qclab::dense::kron( iswap.matrix() , I1 ) ) ;

    mat3 = I3 ;
    iswap.apply( qclab::Side::Left , qclab::Op::ConjTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 , qclab::dense::kron( iswapH , I1 ) ) ;

    mat3 = I3 ;
    iswap.apply( qclab::Side::Right , qclab::Op::ConjTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 , qclab::dense::kron( iswapH , I1 ) ) ;

    int qnew[] = { 1 , 2 } ;
    iswap.setQubits( &qnew[0] ) ;
    mat3 = I3 ;
    iswap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 ,
                                   qclab::dense::kron( I1 , iswap.matrix() ) ) ;

    mat3 = I3 ;
    iswap.apply( qclab::Side::Right , qclab::Op::NoTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 ,
                                   qclab::dense::kron( I1 , iswap.matrix() ) ) ;

    mat3 = I3 ;
    iswap.apply( qclab::Side::Left , qclab::Op::ConjTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 , qclab::dense::kron( I1 , iswapH ) ) ;

    mat3 = I3 ;
    iswap.apply( qclab::Side::Right , qclab::Op::ConjTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 , qclab::dense::kron( I1 , iswapH ) ) ;
  }

  {
    qclab::qgates::iSWAP< T >  iswap( 0 , 2 ) ;

    const T i(0,1) ;
    auto check = qclab::dense::zeros< T >( 8 ) ;
    check(0,0) = 1 ;
    check(4,1) = i ;
    check(2,2) = 1 ;
    check(6,3) = i ;
    check(1,4) = i ;
    check(5,5) = 1 ;
    check(3,6) = i ;
    check(7,7) = 1 ;

    // apply (3 qubits)
    auto mat3 = I3 ;
    iswap.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    test_qclab_qgates_iSWAP_check( mat3 , check ) ;
  }

}